

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-inventory.c
# Opt level: O1

wchar_t borg_slot(wchar_t tval,wchar_t sval)

{
  byte bVar1;
  uint8_t *puVar2;
  wchar_t wVar3;
  ulong uVar4;
  
  if ((ulong)z_info->pack_size == 0) {
    wVar3 = L'\xffffffff';
  }
  else {
    puVar2 = &borg_items->iqty;
    wVar3 = L'\xffffffff';
    uVar4 = 0;
    do {
      bVar1 = *puVar2;
      if (((((bVar1 != 0) && ((_Bool)puVar2[-6] == true)) && ((uint)puVar2[-4] == tval)) &&
          ((uint)puVar2[-3] == sval)) &&
         ((wVar3 < L'\0' ||
          ((bVar1 <= borg_items[(uint)wVar3].iqty &&
           ((borg_items[(uint)wVar3].pval <= *(short *)(puVar2 + -2) ||
            (bVar1 <= borg_items[(uint)wVar3].iqty)))))))) {
        wVar3 = (wchar_t)uVar4;
      }
      uVar4 = uVar4 + 1;
      puVar2 = puVar2 + 0x388;
    } while (z_info->pack_size != uVar4);
  }
  return wVar3;
}

Assistant:

int borg_slot(int tval, int sval)
{
    int i, n = -1;

    /* Scan the pack */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item *item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Skip un-aware items */
        if (!item->aware)
            continue;

        /* Require correct tval */
        if (item->tval != tval)
            continue;

        /* Require correct sval */
        if (item->sval != sval)
            continue;

        /* Prefer smallest pile */
        if ((n >= 0) && (item->iqty > borg_items[n].iqty))
            continue;

        /* Prefer largest "pval" (even if smaller pile)*/
        if ((n >= 0) && (item->pval < borg_items[n].pval)
            && (item->iqty > borg_items[n].iqty))
            continue;

        /* Save this item */
        n = i;
    }

    /* Done */
    return n;
}